

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
 __thiscall
andres::
RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
::insert(RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
         *this,value_type *value)

{
  const_iterator __position;
  bool bVar1;
  undefined8 extraout_RDX;
  pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  *in_RDI;
  pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  pVar2;
  iterator i;
  bool found;
  pair<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar3;
  key_type *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  __normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_30;
  undefined1 local_21;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_10;
  undefined1 local_8;
  
  local_21 = 1;
  local_30._M_current =
       (Adjacency<unsigned_long> *)
       lower_bound((RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
  end((RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
       *)in_stack_ffffffffffffff48);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                      *)in_RDI,&in_stack_ffffffffffffff48->first);
  uVar3 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff48 =
         (pair<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
          *)&in_RDI[1].second;
    __gnu_cxx::
    __normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
    ::operator*(&local_30);
    uVar3 = std::less<andres::graph::Adjacency<unsigned_long>_>::operator()
                      ((less<andres::graph::Adjacency<unsigned_long>_> *)in_RDI,
                       (Adjacency<unsigned_long> *)in_stack_ffffffffffffff48,
                       (Adjacency<unsigned_long> *)0x19e0fc);
  }
  if ((bool)uVar3 != false) {
    __gnu_cxx::
    __normal_iterator<andres::graph::Adjacency<unsigned_long>const*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>
    ::__normal_iterator<andres::graph::Adjacency<unsigned_long>*>
              (&in_RDI->first,&in_stack_ffffffffffffff48->first);
    __position._M_current._7_1_ = uVar3;
    __position._M_current._0_7_ = in_stack_ffffffffffffff58;
    local_30._M_current =
         (Adjacency<unsigned_long> *)
         std::
         vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
         ::insert((vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                   *)in_RDI,__position,(value_type *)in_stack_ffffffffffffff48);
    local_21 = 0;
  }
  std::
  make_pair<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>&,bool>
            ((__normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
              *)in_RDI,(bool *)in_stack_ffffffffffffff48);
  std::
  pair<__gnu_cxx::__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool>
  ::
  pair<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>,_bool,_true>
            (in_RDI,in_stack_ffffffffffffff48);
  pVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar2.second = (bool)local_8;
  pVar2.first._M_current = local_10._M_current;
  return pVar2;
}

Assistant:

inline std::pair<typename RandomAccessSet<Key, Comparison, Allocator>::const_iterator, bool>
RandomAccessSet<Key, Comparison, Allocator>::insert(
    const typename RandomAccessSet<Key, Comparison, Allocator>::value_type& value
) {
    bool found(true);
    iterator i(lower_bound(static_cast<Key>(value)));
    if(i == end() || compare_(static_cast<Key>(value), *i)) {
        i = vector_.insert(i, static_cast<Key>(value));
        found = false;
    }
    return std::make_pair(i, !found);
}